

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)

{
  int iVar1;
  tc_symtype_t tVar2;
  uint uVar3;
  uint uVar4;
  CTPNArglistBase *this;
  CTPNArgBase *this_00;
  CTcPrsNode *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsNode *in_RDI;
  int errcode;
  CTcConstVal cval_1;
  CTcSymbol *sym_1;
  CTcPrsNode *arg_1;
  CTcPrsNode *arg_2;
  CTPNArg *curarg;
  int errhandling;
  CTcConstVal cval;
  CTcSymbol *sym;
  CTcPrsNode *arg;
  CTPNArglist *arglist;
  CTcConstVal *in_stack_fffffffffffffef8;
  CTcPrsSymtab *in_stack_ffffffffffffff00;
  CTcConstVal *this_01;
  CTcPrsNode *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  bool local_ad;
  CTcConstVal local_a8;
  CTcSymbol *local_80;
  CTcPrsNode *local_78;
  CTcPrsNode *local_70;
  CTPNArgBase *local_68;
  int local_60;
  CTcConstVal local_50;
  CTcSymbol *local_28;
  
  this = &parse_arg_list()->super_CTPNArglistBase;
  if (this == (CTPNArglistBase *)0x0) {
    return (CTcPrsNode *)0x0;
  }
  if ((in_RDI != (CTcPrsNode *)0x0) &&
     (iVar1 = (*(in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(in_RDI,"defined",7),
     iVar1 != 0)) {
    iVar1 = CTPNArglistBase::get_argc(this);
    if (iVar1 == 1) {
      this_00 = &CTPNArglistBase::get_arg_list_head(this)->super_CTPNArgBase;
      pCVar5 = CTPNArgBase::get_arg_expr(this_00);
      iVar1 = (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
      if (CONCAT44(extraout_var,iVar1) != 0) {
        CTcParser::get_global_symtab(G_prs);
        (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
        (*(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])();
        local_28 = CTcPrsSymtab::find(in_stack_ffffffffffffff00,
                                      (textchar_t *)in_stack_fffffffffffffef8,0x258b47);
        CTcConstVal::CTcConstVal(&local_50);
        local_ad = false;
        if (local_28 != (CTcSymbol *)0x0) {
          tVar2 = CTcSymbolBase::get_type(&local_28->super_CTcSymbolBase);
          local_ad = tVar2 != TC_SYM_UNKNOWN;
        }
        CTcConstVal::set_bool(&local_50,(uint)local_ad);
        CTcConstVal::set_ctc(&local_50,1);
        pCVar5 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x258bb9);
        CTPNConst::CTPNConst((CTPNConst *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        return pCVar5;
      }
    }
    CTcTokenizer::log_error(0x2be1);
  }
  if ((in_RDI != (CTcPrsNode *)0x0) &&
     (iVar1 = (*(in_RDI->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(in_RDI,"__objref",8),
     iVar1 != 0)) {
    local_60 = 0;
    local_68 = &CTPNArglistBase::get_arg_list_head(this)->super_CTPNArgBase;
    iVar1 = CTPNArglistBase::get_argc(this);
    if (2 < iVar1) {
      CTcTokenizer::log_error(0x2be2);
      return in_RDI;
    }
    iVar1 = CTPNArglistBase::get_argc(this);
    if (iVar1 == 2) {
      local_70 = CTPNArgBase::get_arg_expr(local_68);
      local_68 = &CTPNArgBase::get_next_arg(local_68)->super_CTPNArgBase;
      iVar1 = (*(local_70->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(local_70,"warn",4);
      if (iVar1 == 0) {
        iVar1 = (*(local_70->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xe])(local_70,"error",5);
        if (iVar1 == 0) {
          CTcTokenizer::log_error(0x2be2);
          return in_RDI;
        }
        local_60 = 2;
      }
      else {
        local_60 = 1;
      }
    }
    local_78 = CTPNArgBase::get_arg_expr(local_68);
    iVar1 = (*(local_78->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
    if (CONCAT44(extraout_var_00,iVar1) != 0) {
      CTcParser::get_global_symtab(G_prs);
      (*(local_78->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
      (*(local_78->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])();
      local_80 = CTcPrsSymtab::find(in_stack_ffffffffffffff00,
                                    (textchar_t *)in_stack_fffffffffffffef8,0x258dce);
      CTcConstVal::CTcConstVal(&local_a8);
      if ((local_80 != (CTcSymbol *)0x0) &&
         (tVar2 = CTcSymbolBase::get_type(&local_80->super_CTcSymbolBase), tVar2 == TC_SYM_OBJ)) {
        return local_78;
      }
      if ((local_60 != 0) && (iVar1 = CTcParser::get_syntax_only(G_prs), iVar1 == 0)) {
        uVar3 = 0x2d00;
        if (local_80 == (CTcSymbol *)0x0) {
          uVar3 = 0x2b18;
        }
        if (local_60 == 1) {
          uVar4 = (*(local_78->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])();
          iVar1 = (*(local_78->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
          CTcTokenizer::log_warning((int)(ulong)uVar3,(ulong)uVar4,CONCAT44(extraout_var_01,iVar1));
        }
        else {
          uVar4 = (*(local_78->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xd])();
          iVar1 = (*(local_78->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xc])();
          CTcTokenizer::log_error((int)(ulong)uVar3,(ulong)uVar4,CONCAT44(extraout_var_02,iVar1));
        }
      }
      this_01 = &local_a8;
      CTcConstVal::set_bool(this_01,0);
      CTcConstVal::set_ctc(this_01,1);
      pCVar5 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x258f01);
      CTPNConst::CTPNConst((CTPNConst *)this_01,in_stack_fffffffffffffef8);
      return pCVar5;
    }
    CTcTokenizer::log_error(0x2be2);
  }
  pCVar5 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x258f67);
  CTPNCall::CTPNCall((CTPNCall *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08,(CTPNArglist *)in_stack_ffffffffffffff00);
  return pCVar5;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_call(CTcPrsNode *lhs)
{
    /* parse the argument list */
    CTPNArglist *arglist = parse_arg_list();
    if (arglist == 0)
        return 0;

    /* check for the special "defined()" syntax */
    if (lhs != 0 && lhs->sym_text_matches("defined", 7))
    {
        /* make sure we have one argument that's a symbol */
        CTcPrsNode *arg;
        if (arglist->get_argc() == 1
            && (arg = arglist->get_arg_list_head()->get_arg_expr())
                ->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());

            /* 
             *   The result is a constant 'true' or 'nil' node, depending on
             *   whether the symbol is defined.  Note that this is a "compile
             *   time constant" expression, not a true constant - flag it as
             *   such so that we don't generate a warning if this value is
             *   used as the conditional expression of an if, while, or for.
             */
            CTcConstVal cval;
            cval.set_bool(sym != 0 && sym->get_type() != TC_SYM_UNKNOWN);
            cval.set_ctc(TRUE);
            return new CTPNConst(&cval);
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR_DEFINED_SYNTAX);
        }
    }

    /* check for the special "__objref" syntax */
    if (lhs != 0 && lhs->sym_text_matches("__objref", 8))
    {
        /* assume we won't generate an error or warning if it's undefined */
        int errhandling = 0;

        /* get the rightmost argument */
        CTPNArg *curarg = arglist->get_arg_list_head();

        /* if we have other than two arguments, it's an error */
        if (arglist->get_argc() > 2)
        {
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
            return lhs;
        }

        /* if we have two arguments, get the warning/error mode */
        if (arglist->get_argc() == 2)
        {
            /* get the argument, and skip to the next to the left */
            CTcPrsNode *arg = curarg->get_arg_expr();
            curarg = curarg->get_next_arg();

            /* it has to be "warn" or "error" */
            if (arg->sym_text_matches("warn", 4))
            {
                errhandling = 1;
            }
            else if (arg->sym_text_matches("error", 5))
            {
                errhandling = 2;
            }
            else
            {
                G_tok->log_error(TCERR___OBJREF_SYNTAX);
                return lhs;
            }
        }

        /* the first argument must be a symbol */
        CTcPrsNode *arg = curarg->get_arg_expr();
        if (arg->get_sym_text() != 0)
        {
            /* look up the symbol */
            CTcSymbol *sym = G_prs->get_global_symtab()->find(
                arg->get_sym_text(), arg->get_sym_text_len());
            
            /* 
             *   The result is the object reference value if the symbol is
             *   defined as an object, or nil if it's undefined or something
             *   other than an object.
             */
            CTcConstVal cval;
            if (sym != 0 && sym->get_type() == TC_SYM_OBJ)
            {
                /* it's an object - the result is the object symbol */
                return arg;
            }
            else
            {
                /* log a warning or error, if applicable */
                if (errhandling != 0 && !G_prs->get_syntax_only())
                {
                    /* note whether it's undefined or otherwise defined */
                    int errcode =
                        (sym == 0 ? TCERR_UNDEF_SYM : TCERR_SYM_NOT_OBJ);

                    /* log an error or warning, as desired */
                    if (errhandling == 1)
                        G_tok->log_warning(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                    else
                        G_tok->log_error(
                            errcode, (int)arg->get_sym_text_len(),
                            arg->get_sym_text());
                }
                
                /* not defined or non-object - the result is nil */
                cval.set_bool(FALSE);
                cval.set_ctc(TRUE);
                return new CTPNConst(&cval);
            }
        }
        else
        {
            /* invalid syntax */
            G_tok->log_error(TCERR___OBJREF_SYNTAX);
        }
    }

    /* build and return the function call node */
    return new CTPNCall(lhs, arglist);
}